

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  string *psVar1;
  ulong uVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  LogFinisher local_e2;
  byte local_e1;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  StringOutputStream *pSStack_10;
  int count_local;
  StringOutputStream *this_local;
  
  local_51 = 0;
  local_14 = count;
  pSStack_10 = this;
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xbf);
    local_51 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(local_65,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (this->target_ == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xc0);
    local_a1 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_a2,pLVar3);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  uVar4 = (ulong)local_14;
  uVar2 = std::__cxx11::string::size();
  local_e1 = 0;
  if (uVar2 < uVar4) {
    internal::LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xc1);
    local_e1 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_e0,"CHECK failed: (count) <= (target_->size()): ");
    internal::LogFinisher::operator=(&local_e2,pLVar3);
  }
  if ((local_e1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_e0);
  }
  psVar1 = this->target_;
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)psVar1);
  return;
}

Assistant:

void StringOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GE(count, 0);
  GOOGLE_CHECK(target_ != NULL);
  GOOGLE_CHECK_LE(count, target_->size());
  target_->resize(target_->size() - count);
}